

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

void __thiscall BasePort::BasePort(BasePort *this,int portNum,ostream *ostr)

{
  uchar *puVar1;
  long lVar2;
  unsigned_long unaff_retaddr;
  
  this->_vptr_BasePort = (_func_int **)&PTR___cxa_pure_virtual_00121700;
  this->outStr = ostr;
  this->ReadErrorCounter_ = 0;
  this->Protocol_ = PROTOCOL_SEQ_RW;
  this->IsAllBoardsBroadcastCapable_ = false;
  this->IsAllBoardsRev4_5_ = false;
  this->IsAllBoardsRev4_6_ = false;
  this->IsAllBoardsRev6_ = false;
  this->IsAllBoardsRev7_ = false;
  this->IsAllBoardsRev8_9_ = false;
  this->PortNum = portNum;
  this->FwBusGeneration = 0;
  this->newFwBusGeneration = 0;
  this->autoReScan = true;
  this->NumOfNodes_ = 0;
  this->NumOfBoards_ = 0;
  this->BoardInUseMask_ = 0;
  this->max_board = 0;
  this->HubBoard = '\x10';
  BroadcastReadInfo::BroadcastReadInfo(&this->bcReadInfo);
  for (lVar2 = -0x20; lVar2 != 0; lVar2 = lVar2 + 2) {
    *(undefined8 *)((long)((this->bcReadInfo).boardInfo + -4) + lVar2 * 4) = 0;
    (this->FpgaVersion + lVar2)[0] = 0;
    (this->FpgaVersion + lVar2)[1] = 0;
    *(undefined4 *)((long)this->HardwareVersion + lVar2 * 2) = 0;
    puVar1 = this->Node2Board + lVar2 * 4;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    *(undefined2 *)((long)this[1].BoardList + lVar2 + -0x40) = 0x40;
  }
  this->WriteBufferBroadcast = (uchar *)0x0;
  this->ReadBufferBroadcast = (uchar *)0x0;
  this->GenericBuffer = (uchar *)0x0;
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
    this->Node2Board[lVar2] = '\x10';
  }
  AddHardwareVersion(0x10ddc3);
  AddHardwareVersion(0x10ddcd);
  AddHardwareVersion(0x10ddd7);
  AddHardwareVersion(0x10dde1);
  AddHardwareVersion(unaff_retaddr);
  return;
}

Assistant:

BasePort::BasePort(int portNum, std::ostream &ostr):
        outStr(ostr),
        Protocol_(BasePort::PROTOCOL_SEQ_RW),
        IsAllBoardsBroadcastCapable_(false),
        IsAllBoardsRev4_5_(false),
        IsAllBoardsRev4_6_(false),
        IsAllBoardsRev6_(false),
        IsAllBoardsRev7_(false),
        IsAllBoardsRev8_9_(false),
        ReadErrorCounter_(0),
        PortNum(portNum),
        FwBusGeneration(0),
        newFwBusGeneration(0),
        autoReScan(true),
        NumOfNodes_(0),
        NumOfBoards_(0),
        BoardInUseMask_(0),
        max_board(0),
        HubBoard(BoardIO::MAX_BOARDS)
{
    size_t i;
    for (i = 0; i < BoardIO::MAX_BOARDS; i++) {
        BoardList[i] = 0;
        FirmwareVersion[i] = 0;
        FpgaVersion[i] = 0;
        HardwareVersion[i] = 0;
        Board2Node[i] = MAX_NODES;
    }
    ReadBufferBroadcast = 0;
    WriteBufferBroadcast = 0;
    GenericBuffer = 0;
    for (i = 0; i < MAX_NODES; i++)
        Node2Board[i] = BoardIO::MAX_BOARDS;
    // Note that AddHardwareVersion will not add duplicates
    BasePort::AddHardwareVersion(QLA1_String);
    BasePort::AddHardwareVersion(dRA1_String);
    BasePort::AddHardwareVersion(DQLA_String);
    BasePort::AddHardwareVersion(BCFG_String);
    BasePort::AddHardwareVersion(0x54455354); // "TEST"
}